

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cc
# Opt level: O0

vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_> *
__thiscall
tt::net::Epoll::getEventsRequest
          (vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
           *__return_storage_ptr__,Epoll *this,int events_num)

{
  bool bVar1;
  reference pvVar2;
  element_type *peVar3;
  LogStream *this_00;
  Logger local_1020;
  undefined1 local_38 [8];
  SP_Channel cur_req;
  int fd;
  int i;
  int events_num_local;
  Epoll *this_local;
  vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
  *req_data;
  
  std::
  vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>::
  vector(__return_storage_ptr__);
  for (cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _4_4_ = 0;
      cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ < events_num;
      cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_ + 1) {
    pvVar2 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                       (&this->m_events,
                        (long)cur_req.
                              super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi._4_4_);
    cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
         = (pvVar2->data).fd;
    std::shared_ptr<tt::net::Channel>::shared_ptr
              ((shared_ptr<tt::net::Channel> *)local_38,
               this->m_fd2chan +
               (int)cur_req.super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      pvVar2 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                         (&this->m_events,
                          (long)cur_req.
                                super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._4_4_);
      Channel::setRevents(peVar3,pvVar2->events);
      peVar3 = std::__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      Channel::setEvents(peVar3,0);
      std::
      vector<std::shared_ptr<tt::net::Channel>,_std::allocator<std::shared_ptr<tt::net::Channel>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_38);
    }
    else {
      Logger::Logger(&local_1020,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/Epoll.cc"
                     ,0x8e);
      this_00 = Logger::stream(&local_1020);
      LogStream::operator<<(this_00,"SP cur_req is invaild");
      Logger::~Logger(&local_1020);
    }
    std::shared_ptr<tt::net::Channel>::~shared_ptr((shared_ptr<tt::net::Channel> *)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SP_Channel> Epoll::getEventsRequest(int events_num){

	std::vector<SP_Channel> req_data;

	for( int i = 0 ; i < events_num ; ++ i ){

		//获取有事件产生的描述符
		int fd = m_events[i].data.fd;

		SP_Channel cur_req = m_fd2chan[fd];
		
		if(cur_req){
			
			cur_req->setRevents(m_events[i].events);
			cur_req->setEvents(0);

			//加入线程池之前将 Timer 和 request 分离
			
			//cur_req->seperateTimer();

			req_data.push_back(cur_req);
		}else{
			LOG << "SP cur_req is invaild";
		
		}
	}

	return req_data;
}